

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O1

bool tinyusdz::tokenize_variantElement
               (string *elementName,
               array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
               *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  string *psVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result_1;
  string local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  pointer local_b8;
  string local_b0;
  string *local_90;
  long *local_88;
  ulong local_80;
  long local_78 [2];
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_c8._M_allocated_capacity = 0;
  local_c8._8_8_ = (pointer)0x0;
  local_b8 = (pointer)0x0;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"{","");
  if ((pointer)elementName->_M_string_length < local_e8._M_string_length) {
    bVar8 = false;
  }
  else if ((pointer)local_e8._M_string_length == (pointer)0x0) {
    bVar8 = true;
  }
  else {
    iVar4 = bcmp(local_e8._M_dataplus._M_p,(elementName->_M_dataplus)._M_p,local_e8._M_string_length
                );
    bVar8 = iVar4 == 0;
  }
  if (bVar8) {
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"}","");
    if (elementName->_M_string_length < local_80) goto LAB_00142a13;
    lVar7 = std::__cxx11::string::find
                      ((char *)elementName,(ulong)local_88,elementName->_M_string_length - local_80)
    ;
    bVar9 = lVar7 != -1;
  }
  else {
LAB_00142a13:
    bVar9 = false;
  }
  if ((bVar8) && (local_88 != local_78)) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    bVar8 = false;
    goto LAB_00142e3c;
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"{","");
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"}","");
  unwrap(&local_68,elementName,&local_e8,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_90 = (string *)result;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"=","");
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = 0x147ae15;
  uVar5 = 0;
  do {
    uVar5 = std::__cxx11::string::find_first_not_of
                      ((char *)&local_68,(ulong)local_b0._M_dataplus._M_p,uVar5);
    if (uVar5 == 0xffffffffffffffff) break;
    uVar5 = std::__cxx11::string::find((char *)&local_68,(ulong)local_b0._M_dataplus._M_p,uVar5);
    std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               &local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  local_e8.field_2._M_allocated_capacity = (size_type)local_b8;
  local_e8._M_string_length = local_c8._8_8_;
  local_e8._M_dataplus._M_p = (pointer)local_c8._M_allocated_capacity;
  local_c8._M_allocated_capacity =
       (size_type)
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c8._8_8_ =
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  psVar3 = local_90;
  lVar7 = (long)(local_c8._8_8_ - local_c8._0_8_) >> 5;
  if (lVar7 == 2) {
    bVar8 = true;
    if (local_90 == (string *)0x0) goto LAB_00142e1b;
    uVar5 = *(size_type *)(local_c8._M_allocated_capacity + 8);
    if (uVar5 != 0) {
      uVar6 = 0;
      lVar7 = 0;
      do {
        lVar7 = lVar7 + (ulong)(*(char *)(*local_c8._M_allocated_capacity + uVar6) == '=');
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      if (lVar7 != 0) goto LAB_00142e19;
    }
    bVar9 = uVar5 != 0;
    if (bVar9) {
      bVar9 = true;
      uVar6 = 1;
      do {
        cVar2 = *(char *)((*local_c8._M_allocated_capacity - 1) + uVar6);
        if ((cVar2 == '\n') || (cVar2 == '\r')) break;
        bVar9 = uVar6 < uVar5;
        bVar10 = uVar6 != uVar5;
        uVar6 = uVar6 + 1;
      } while (bVar10);
    }
    if (!bVar9) {
      uVar5 = *(size_type *)(local_c8._M_allocated_capacity + 0x28);
      if (uVar5 != 0) {
        uVar6 = 0;
        lVar7 = 0;
        do {
          lVar7 = lVar7 + (ulong)((((pointer)(local_c8._M_allocated_capacity + 0x20))->_M_dataplus).
                                  _M_p[uVar6] == '=');
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        if (lVar7 != 0) goto LAB_00142e19;
      }
      bVar9 = uVar5 != 0;
      if (bVar9) {
        bVar9 = true;
        uVar6 = 1;
        do {
          cVar2 = (((pointer)(local_c8._M_allocated_capacity + 0x20))->_M_dataplus)._M_p[uVar6 - 1];
          if ((cVar2 == '\n') || (cVar2 == '\r')) break;
          bVar9 = uVar6 < uVar5;
          bVar10 = uVar6 != uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar10);
      }
      if (!bVar9) {
        std::__cxx11::string::_M_assign(local_90);
        std::__cxx11::string::_M_assign(psVar3 + 0x20);
        goto LAB_00142e1b;
      }
    }
LAB_00142e19:
    bVar8 = false;
  }
  else {
    if (lVar7 != 1) goto LAB_00142e19;
    bVar8 = true;
    if (local_90 != (string *)0x0) {
      uVar5 = *(size_type *)(local_c8._M_allocated_capacity + 8);
      if (uVar5 != 0) {
        uVar6 = 0;
        lVar7 = 0;
        do {
          lVar7 = lVar7 + (ulong)(*(char *)(*local_c8._M_allocated_capacity + uVar6) == '=');
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        if (lVar7 != 0) goto LAB_00142e19;
      }
      bVar9 = uVar5 != 0;
      if (bVar9) {
        bVar9 = true;
        uVar6 = 1;
        do {
          cVar2 = *(char *)((*local_c8._M_allocated_capacity - 1) + uVar6);
          if ((cVar2 == '\n') || (cVar2 == '\r')) break;
          bVar9 = uVar6 < uVar5;
          bVar10 = uVar6 != uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar10);
      }
      if (bVar9) goto LAB_00142e19;
      std::__cxx11::string::_M_assign(local_90);
      local_e8._M_string_length = 0;
      local_e8.field_2._M_allocated_capacity =
           local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::operator=(psVar3 + 0x20,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_00142e1b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_00142e3c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c8);
  return bVar8;
}

Assistant:

bool tokenize_variantElement(const std::string &elementName,
                             std::array<std::string, 2> *result) {
  std::vector<std::string> toks;

  // Ensure ElementPath is quoted with '{' and '}'
  if (startsWith(elementName, "{") && endsWith(elementName, "}")) {
    // ok
  } else {
    return false;
  }

  // Remove variant quotation
  std::string name = unwrap(elementName, "{", "}");

  toks = split(name, "=");
  if (toks.size() == 1) {
    if (result) {
      // ensure '=' and newline does not exist.
      if (counts(toks[0], '=') || hasNewline(toks[0])) {
        return false;
      }

      (*result)[0] = toks[0];
      (*result)[1] = std::string();
    }
    return true;
  } else if (toks.size() == 2) {
    if (result) {
      // ensure '=' and newline does not exist.
      if (counts(toks[0], '=') || hasNewline(toks[0])) {
        return false;
      }

      if (counts(toks[1], '=') || hasNewline(toks[1])) {
        return false;
      }

      (*result)[0] = toks[0];
      (*result)[1] = toks[1];
    }
    return true;
  } else {
    return false;
  }
}